

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *
tinyusdz::lerp<tinyusdz::value::vector3d>
          (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *a,
          vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *b,double t)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  double dVar9;
  double dVar10;
  ulong uVar11;
  long lVar12;
  ulong __new_size;
  double dVar13;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = ((long)(a->
                  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(a->
                  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  __new_size = ((long)(b->
                      super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar11 <= __new_size) {
    __new_size = uVar11;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::resize
              (__return_storage_ptr__,__new_size);
    pvVar6 = (a->
             super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (b->
             super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(a->
              super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 ==
        (long)(b->
              super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) {
      dVar13 = 1.0 - t;
      pvVar8 = (__return_storage_ptr__->
               super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = 0x10;
      do {
        dVar4 = *(double *)((long)&pvVar6->x + lVar12);
        dVar5 = *(double *)((long)&pvVar7->x + lVar12);
        pdVar1 = (double *)((long)pvVar6 + lVar12 + -0x10);
        dVar9 = pdVar1[1];
        pdVar2 = (double *)((long)pvVar7 + lVar12 + -0x10);
        dVar10 = pdVar2[1];
        pdVar3 = (double *)((long)pvVar8 + lVar12 + -0x10);
        *pdVar3 = *pdVar2 * t + *pdVar1 * dVar13;
        pdVar3[1] = dVar10 * t + dVar9 * dVar13;
        *(double *)((long)&pvVar8->x + lVar12) = dVar5 * t + dVar4 * dVar13;
        lVar12 = lVar12 + 0x18;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}